

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_signature.hpp
# Opt level: O0

void chaiscript::dispatch::detail::function_signature<int_Returned_Converted_Config::*>
               (offset_in_Returned_Converted_Config_to_int *f)

{
  offset_in_Returned_Converted_Config_to_int *f_local;
  
  Function_Signature<int,chaiscript::dispatch::detail::Function_Params<Returned_Converted_Config&>,true,true,true,false>
  ::Function_Signature<int_Returned_Converted_Config::*const&>
            ((Function_Signature<int,chaiscript::dispatch::detail::Function_Params<Returned_Converted_Config&>,true,true,true,false>
              *)((long)&f_local + 7),f);
  return;
}

Assistant:

auto function_signature(const Func &f) {
    if constexpr (has_call_operator<Func>::value) {
      return Function_Signature<typename decltype(Function_Signature{&std::decay_t<Func>::operator()})::Return_Type,
                                typename decltype(Function_Signature{&std::decay_t<Func>::operator()})::Param_Types,
                                decltype(Function_Signature{&std::decay_t<Func>::operator()})::is_noexcept,
                                false,
                                false,
                                true>{};
    } else {
      return Function_Signature{f};
    }
  }